

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * mult(Bigint *a,Bigint *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Bigint *pBVar4;
  ULong *pUVar5;
  ulong uVar6;
  ULong *pUVar7;
  bool bVar8;
  unsigned_long_long z;
  unsigned_long_long carry;
  ULong *pUStack_68;
  ULong y;
  ULong *xc0;
  ULong *xc;
  ULong *xbe;
  ULong *xb;
  ULong *xae;
  ULong *xa;
  ULong *x;
  int wc;
  int wb;
  int wa;
  int k;
  Bigint *c;
  Bigint *b_local;
  Bigint *a_local;
  
  c = b;
  b_local = a;
  if (a->wds < b->wds) {
    c = a;
    b_local = b;
  }
  wb = b_local->k;
  iVar1 = b_local->wds;
  iVar2 = c->wds;
  x._0_4_ = iVar1 + iVar2;
  if (b_local->maxwds < (int)x) {
    wb = wb + 1;
  }
  pBVar4 = Balloc(wb);
  xa = pBVar4->x;
  pUVar5 = xa + (int)x;
  for (; xa < pUVar5; xa = xa + 1) {
    *xa = 0;
  }
  pUStack_68 = pBVar4->x;
  xbe = c->x;
  while (xbe < c->x + iVar2) {
    uVar3 = *xbe;
    if (uVar3 != 0) {
      xc0 = pUStack_68;
      z = 0;
      xa = b_local->x;
      do {
        pUVar5 = xa + 1;
        uVar6 = (ulong)*xa * (ulong)uVar3 + (ulong)*xc0 + z;
        z = uVar6 >> 0x20;
        pUVar7 = xc0 + 1;
        *xc0 = (ULong)uVar6;
        xc0 = pUVar7;
        xa = pUVar5;
      } while (pUVar5 < b_local->x + iVar1);
      *pUVar7 = (ULong)(uVar6 >> 0x20);
    }
    pUStack_68 = pUStack_68 + 1;
    xbe = xbe + 1;
  }
  xc0 = pBVar4->x + (int)x;
  while( true ) {
    bVar8 = false;
    if (0 < (int)x) {
      bVar8 = xc0[-1] == 0;
      xc0 = xc0 + -1;
    }
    if (!bVar8) break;
    x._0_4_ = (int)x + -1;
  }
  pBVar4->wds = (int)x;
  return pBVar4;
}

Assistant:

static Bigint *
mult(Bigint *a, Bigint *b MTd)
{
	Bigint *c;
	int k, wa, wb, wc;
	ULong *x, *xa, *xae, *xb, *xbe, *xc, *xc0;
	ULong y;
#ifdef ULLong
	ULLong carry, z;
#else
	ULong carry, z;
#ifdef Pack_32
	ULong z2;
#endif
#endif

	if (a->wds < b->wds) {
		c = a;
		a = b;
		b = c;
		}
	k = a->k;
	wa = a->wds;
	wb = b->wds;
	wc = wa + wb;
	if (wc > a->maxwds)
		k++;
	c = Balloc(k MTa);
	for(x = c->x, xa = x + wc; x < xa; x++)
		*x = 0;
	xa = a->x;
	xae = xa + wa;
	xb = b->x;
	xbe = xb + wb;
	xc0 = c->x;
#ifdef ULLong
	for(; xb < xbe; xc0++) {
		if ((y = *xb++)) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = *x++ * (ULLong)y + *xc + carry;
				carry = z >> 32;
				*xc++ = z & FFFFFFFF;
				}
				while(x < xae);
			*xc = carry;
			}
		}
#else
#ifdef Pack_32
	for(; xb < xbe; xb++, xc0++) {
		if ((y = *xb & 0xffff)) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = (*x & 0xffff) * y + (*xc & 0xffff) + carry;
				carry = z >> 16;
				z2 = (*x++ >> 16) * y + (*xc >> 16) + carry;
				carry = z2 >> 16;
				Storeinc(xc, z2, z);
				}
				while(x < xae);
			*xc = carry;
			}
		if ((y = *xb >> 16)) {
			x = xa;
			xc = xc0;
			carry = 0;
			z2 = *xc;
			do {
				z = (*x & 0xffff) * y + (*xc >> 16) + carry;
				carry = z >> 16;
				Storeinc(xc, z, z2);
				z2 = (*x++ >> 16) * y + (*xc & 0xffff) + carry;
				carry = z2 >> 16;
				}
				while(x < xae);
			*xc = z2;
			}
		}
#else
	for(; xb < xbe; xc0++) {
		if (y = *xb++) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = *x++ * y + *xc + carry;
				carry = z >> 16;
				*xc++ = z & 0xffff;
				}
				while(x < xae);
			*xc = carry;
			}
		}
#endif
#endif
	for(xc0 = c->x, xc = xc0 + wc; wc > 0 && !*--xc; --wc) ;
	c->wds = wc;
	return c;
	}